

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_68(QPDF *pdf,char *arg2)

{
  ulong uVar1;
  long *plVar2;
  shared_ptr<Buffer> b1;
  QPDFObjectHandle qstream;
  shared_ptr<Buffer> b2;
  QPDFObjectHandle root;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60 [2];
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  QPDF::getRoot();
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/QStream","");
  QPDFObjectHandle::getKey(local_50);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_70);
  uVar1 = Buffer::getSize();
  if (10 < uVar1) {
    plVar2 = (long *)Buffer::getBuffer();
    if ((char)plVar2[1] == 'w' && *plVar2 == 0x7777777777777777) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"filtered stream data okay",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
    }
  }
  QPDFObjectHandle::getRawStreamData();
  uVar1 = Buffer::getSize();
  if (10 < uVar1) {
    plVar2 = (long *)Buffer::getBuffer();
    if ((short)plVar2[1] == 0x4649 && *plVar2 == 0x464a1000e0ffd8ff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"raw stream data okay",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

static void
test_68(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle qstream = root.getKey("/QStream");
    try {
        qstream.getStreamData();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::exception& e) {
        std::cout << "get unfilterable stream: " << e.what() << std::endl;
    }
    std::shared_ptr<Buffer> b1 = qstream.getStreamData(qpdf_dl_all);
    if ((b1->getSize() > 10) && (memcmp(b1->getBuffer(), "wwwwwwwww", 9) == 0)) {
        std::cout << "filtered stream data okay" << std::endl;
    }
    std::shared_ptr<Buffer> b2 = qstream.getRawStreamData();
    if ((b2->getSize() > 10) &&
        (memcmp(b2->getBuffer(), "\xff\xd8\xff\xe0\x00\x10\x4a\x46\x49\x46", 10) == 0)) {
        std::cout << "raw stream data okay" << std::endl;
    }
}